

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O3

Id __thiscall
dxil_spv::Converter::Impl::build_sampled_image(Impl *this,Id image_id,Id sampler_id,bool comparison)

{
  pointer *ppCVar1;
  Dim dim;
  pointer pCVar2;
  Instruction *pIVar3;
  iterator __position;
  bool arrayed;
  bool ms;
  uint typeId;
  Id IVar4;
  mapped_type *pmVar5;
  Builder *this_00;
  const_iterator cVar6;
  Operation *this_01;
  undefined7 in_register_00000009;
  pointer pCVar7;
  long lVar8;
  bool bVar9;
  ulong uVar10;
  pointer pCVar11;
  Id *pIVar12;
  Id sampler_id_local;
  Id image_id_local;
  CombinedImageSampler local_50;
  undefined4 local_3c;
  Id local_38;
  Id local_34;
  
  sampler_id_local = sampler_id;
  image_id_local = image_id;
  pmVar5 = std::__detail::
           _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
           ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                         *)&this->handle_to_resource_meta,&image_id_local);
  bVar9 = true;
  if (pmVar5->non_uniform == false) {
    pmVar5 = std::__detail::
             _Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_dxil_spv::Converter::Impl::ResourceMeta>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->handle_to_resource_meta,&sampler_id_local);
    bVar9 = pmVar5->non_uniform;
  }
  pCVar7 = (this->combined_image_sampler_cache).
           super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pCVar2 = (this->combined_image_sampler_cache).
           super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  uVar10 = (long)pCVar2 - (long)pCVar7;
  if (0 < (long)uVar10 >> 6) {
    pCVar11 = (pointer)((long)&pCVar7->image_id + (uVar10 & 0xffffffffffffffc0));
    lVar8 = ((long)uVar10 >> 6) + 1;
    pCVar7 = pCVar7 + 2;
    do {
      if (((pCVar7[-2].image_id == image_id_local) && (pCVar7[-2].sampler_id == sampler_id_local))
         && (pCVar7[-2].non_uniform == bVar9)) {
        pCVar7 = pCVar7 + -2;
        goto LAB_0011f354;
      }
      if (((pCVar7[-1].image_id == image_id_local) && (pCVar7[-1].sampler_id == sampler_id_local))
         && (pCVar7[-1].non_uniform == bVar9)) {
        pCVar7 = pCVar7 + -1;
        goto LAB_0011f354;
      }
      if (((pCVar7->image_id == image_id_local) && (pCVar7->sampler_id == sampler_id_local)) &&
         (pCVar7->non_uniform == bVar9)) goto LAB_0011f354;
      if (((pCVar7[1].image_id == image_id_local) && (pCVar7[1].sampler_id == sampler_id_local)) &&
         (pCVar7[1].non_uniform == bVar9)) {
        pCVar7 = pCVar7 + 1;
        goto LAB_0011f354;
      }
      lVar8 = lVar8 + -1;
      pCVar7 = pCVar7 + 4;
    } while (1 < lVar8);
    uVar10 = (long)pCVar2 - (long)pCVar11;
    pCVar7 = pCVar11;
  }
  lVar8 = (long)uVar10 >> 4;
  if (lVar8 == 3) {
    if (((pCVar7->image_id != image_id_local) || (pCVar7->sampler_id != sampler_id_local)) ||
       (pCVar7->non_uniform != bVar9)) {
      pCVar7 = pCVar7 + 1;
      goto LAB_0011f313;
    }
LAB_0011f354:
    if (pCVar7 != pCVar2) {
      pIVar12 = &pCVar7->combined_id;
      goto LAB_0011f4d2;
    }
  }
  else {
    if (lVar8 == 2) {
LAB_0011f313:
      if (((pCVar7->image_id != image_id_local) || (pCVar7->sampler_id != sampler_id_local)) ||
         (pCVar7->non_uniform != bVar9)) {
        pCVar7 = pCVar7 + 1;
        goto LAB_0011f32b;
      }
      goto LAB_0011f354;
    }
    if (lVar8 == 1) {
LAB_0011f32b:
      if (((pCVar7->image_id == image_id_local) && (pCVar7->sampler_id == sampler_id_local)) &&
         (pCVar7->non_uniform == bVar9)) goto LAB_0011f354;
    }
  }
  this_00 = SPIRVModule::get_builder(this->spirv_module);
  local_50.image_id = image_id_local;
  cVar6 = std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_dxil_spv::ThreadLocalAllocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->id_to_type)._M_h,&local_50.image_id);
  local_3c = (undefined4)CONCAT71(in_register_00000009,comparison);
  if (cVar6.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur ==
      (__node_type *)0x0) {
    typeId = 0;
  }
  else {
    typeId = *(uint *)((long)cVar6.
                             super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                             ._M_cur + 0xc);
  }
  pIVar3 = (this_00->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[typeId];
  if (pIVar3->opCode != OpTypeImage) {
    __assert_fail("isImageType(typeId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.h"
                  ,0xd2,"Dim spv::Builder::getTypeDimensionality(Id) const");
  }
  dim = *(Dim *)(*(long *)&(pIVar3->operands).
                           super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                           ._M_impl.super__Vector_impl_data + 4);
  arrayed = spv::Builder::isArrayedImageType(this_00,typeId);
  ms = spv::Builder::isMultisampledImageType(this_00,typeId);
  pIVar3 = (this_00->module).idToInstruction.
           super__Vector_base<spv::Instruction_*,_dxil_spv::ThreadLocalAllocator<spv::Instruction_*>_>
           ._M_impl.super__Vector_impl_data._M_start[typeId];
  if (pIVar3->opCode != OpTypeImage) {
    __assert_fail("isImageType(typeId)",
                  "/workspace/llm4binary/github/license_c_cmakelists/HansKristian-Work[P]dxil-spirv/third_party/glslang-spirv/SpvBuilder.h"
                  ,0xec,"Id spv::Builder::getImageComponentType(Id) const");
  }
  IVar4 = spv::Builder::makeImageType
                    (this_00,*(pIVar3->operands).
                              super__Vector_base<unsigned_int,_dxil_spv::ThreadLocalAllocator<unsigned_int>_>
                              ._M_impl.super__Vector_impl_data._M_start,dim,local_3c._0_1_,arrayed,
                     ms,1,ImageFormatUnknown);
  IVar4 = spv::Builder::makeSampledImageType(this_00,IVar4);
  this_01 = allocate(this,OpSampledImage,IVar4);
  local_50._0_8_ = &local_38;
  local_38 = image_id_local;
  local_34 = sampler_id_local;
  local_50.combined_id = 2;
  local_50.non_uniform = false;
  local_50._13_3_ = 0;
  Operation::add_ids(this_01,(initializer_list<unsigned_int> *)&local_50);
  add(this,this_01,false);
  if (bVar9 != false) {
    spv::Builder::addDecoration(this_00,this_01->id,DecorationNonUniform,-1);
    this_01->flags = this_01->flags | 1;
  }
  local_50.sampler_id = sampler_id_local;
  local_50.image_id = image_id_local;
  IVar4 = this_01->id;
  local_50.non_uniform = bVar9;
  local_50.combined_id = IVar4;
  __position._M_current =
       (this->combined_image_sampler_cache).
       super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (__position._M_current ==
      (this->combined_image_sampler_cache).
      super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
    ::_M_realloc_insert<dxil_spv::Converter::Impl::CombinedImageSampler>
              (&this->combined_image_sampler_cache,__position,&local_50);
  }
  else {
    (__position._M_current)->image_id = image_id_local;
    (__position._M_current)->sampler_id = sampler_id_local;
    (__position._M_current)->combined_id = IVar4;
    (__position._M_current)->non_uniform = bVar9;
    *(undefined3 *)&(__position._M_current)->field_0xd = local_50._13_3_;
    ppCVar1 = &(this->combined_image_sampler_cache).
               super__Vector_base<dxil_spv::Converter::Impl::CombinedImageSampler,_dxil_spv::ThreadLocalAllocator<dxil_spv::Converter::Impl::CombinedImageSampler>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppCVar1 = *ppCVar1 + 1;
  }
  pIVar12 = &this_01->id;
LAB_0011f4d2:
  return *pIVar12;
}

Assistant:

spv::Id Converter::Impl::build_sampled_image(spv::Id image_id, spv::Id sampler_id, bool comparison)
{
	bool is_non_uniform =
	    handle_to_resource_meta[image_id].non_uniform || handle_to_resource_meta[sampler_id].non_uniform;

	auto itr = std::find_if(combined_image_sampler_cache.begin(), combined_image_sampler_cache.end(),
	                        [&](const CombinedImageSampler &combined) {
		                        return combined.image_id == image_id && combined.sampler_id == sampler_id &&
		                               combined.non_uniform == is_non_uniform;
	                        });

	if (itr != combined_image_sampler_cache.end())
		return itr->combined_id;

	auto &builder = spirv_module.get_builder();
	spv::Id image_type_id = get_type_id(image_id);
	spv::Dim dim = builder.getTypeDimensionality(image_type_id);
	bool arrayed = builder.isArrayedImageType(image_type_id);
	bool multisampled = builder.isMultisampledImageType(image_type_id);
	spv::Id sampled_format = builder.getImageComponentType(image_type_id);

	image_type_id =
	    builder.makeImageType(sampled_format, dim, comparison, arrayed, multisampled, 1, spv::ImageFormatUnknown);

	Operation *op = allocate(spv::OpSampledImage, builder.makeSampledImageType(image_type_id));
	op->add_ids({ image_id, sampler_id });
	add(op);

	if (is_non_uniform)
	{
		builder.addDecoration(op->id, spv::DecorationNonUniformEXT);
		op->flags |= Operation::SinkableBit;
	}

	combined_image_sampler_cache.push_back({ image_id, sampler_id, op->id, is_non_uniform });
	return op->id;
}